

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>::swap
          (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
           *this,btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *x,allocator_type *alloc)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  slot_type *psVar7;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  **__first1;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  **__last1;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  **__first2;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *pbVar8;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_> *c;
  field_type *__a;
  field_type *__b;
  int local_54;
  int i;
  size_type to_move;
  slot_type *end;
  slot_type *b;
  slot_type *a;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *larger;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *smaller;
  allocator_type *alloc_local;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *x_local;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *this_local;
  
  smaller = (btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
             *)alloc;
  alloc_local = (allocator_type *)x;
  x_local = this;
  bVar1 = leaf(this);
  bVar2 = leaf((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                *)alloc_local);
  if (bVar1 != bVar2) {
    __assert_fail("leaf() == x->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0x942,
                  "void phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>>::swap(btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>]"
                 );
  }
  a = (slot_type *)alloc_local;
  larger = this;
  bVar3 = count(this);
  bVar4 = count((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *)a);
  if (bVar4 < bVar3) {
    std::
    swap<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>*>
              (&larger,(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                        **)&a);
  }
  b = slot(larger,0);
  end = slot((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              *)a,0);
  bVar3 = count(larger);
  psVar7 = b + (int)(uint)bVar3;
  for (; b != psVar7; b = b + 1) {
    common_params<int,_std::greater<int>,_std::allocator<int>,_256,_false,_phmap::priv::set_slot_policy<int>_>
    ::swap((allocator<int> *)smaller,b,end);
    end = end + 1;
  }
  bVar3 = count((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *)a);
  bVar4 = count(larger);
  psVar7 = a;
  bVar5 = count(larger);
  bVar6 = count(larger);
  uninitialized_move_n
            ((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              *)psVar7,(long)(int)((uint)bVar3 - (uint)bVar4),(ulong)bVar5,(ulong)bVar6,larger,
             (allocator_type *)smaller);
  psVar7 = a;
  bVar5 = count(larger);
  value_destroy_n((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                   *)psVar7,(ulong)bVar5,(long)(int)((uint)bVar3 - (uint)bVar4),
                  (allocator_type *)smaller);
  bVar1 = leaf(this);
  if (!bVar1) {
    __first1 = mutable_child(larger,0);
    pbVar8 = larger;
    bVar3 = count(larger);
    __last1 = mutable_child(pbVar8,(long)(int)(bVar3 + 1));
    __first2 = mutable_child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                              *)a,0);
    std::
    swap_ranges<phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>**,phmap::priv::btree_node<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>**>
              (__first1,__last1,__first2);
    for (local_54 = 0; bVar3 = count(larger), local_54 <= (int)(uint)bVar3; local_54 = local_54 + 1)
    {
      pbVar8 = child(larger,(long)local_54);
      set_parent(pbVar8,larger);
      pbVar8 = child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                      *)a,(long)local_54);
      set_parent(pbVar8,(btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                         *)a);
    }
    for (; bVar3 = count((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                          *)a), pbVar8 = larger, local_54 <= (int)(uint)bVar3;
        local_54 = local_54 + 1) {
      c = child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                 *)a,(long)local_54);
      init_child(pbVar8,local_54,c);
      clear_child((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                   *)a,(long)local_54);
    }
  }
  __a = mutable_count(this);
  __b = mutable_count((btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                       *)alloc_local);
  std::swap<unsigned_char>(__a,__b);
  return;
}

Assistant:

void btree_node<P>::swap(btree_node *x, allocator_type *alloc) {
        using std::swap;
        assert(leaf() == x->leaf());

        // Determine which is the smaller/larger node.
        btree_node *smaller = this, *larger = x;
        if (smaller->count() > larger->count()) {
            swap(smaller, larger);
        }

        // Swap the values.
        for (slot_type *a = smaller->slot(0), *b = larger->slot(0),
                 *end = a + smaller->count();
             a != end; ++a, ++b) {
            params_type::swap(alloc, a, b);
        }

        // Move values that can't be swapped.
        const size_type to_move = larger->count() - smaller->count();
        larger->uninitialized_move_n(to_move, smaller->count(), smaller->count(),
                                     smaller, alloc);
        larger->value_destroy_n(smaller->count(), to_move, alloc);

        if (!leaf()) {
            // Swap the child pointers.
            std::swap_ranges(&smaller->mutable_child(0),
                             &smaller->mutable_child(smaller->count() + 1),
                             &larger->mutable_child(0));
            // Update swapped children's parent pointers.
            int i = 0;
            for (; i <= smaller->count(); ++i) {
                smaller->child(i)->set_parent(smaller);
                larger->child(i)->set_parent(larger);
            }
            // Move the child pointers that couldn't be swapped.
            for (; i <= larger->count(); ++i) {
                smaller->init_child(i, larger->child(i));
                larger->clear_child(i);
            }
        }

        // Swap the counts.
        swap(mutable_count(), x->mutable_count());
    }